

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O1

optional<tinyusdz::value::quatf> * __thiscall
tinyusdz::XformOp::get_value<tinyusdz::value::quatf>
          (optional<tinyusdz::value::quatf> *__return_storage_ptr__,XformOp *this,double t,
          TimeSampleInterpolationType interp)

{
  bool bVar1;
  PrimVar *this_00;
  quatf value;
  optional<tinyusdz::value::quatf> local_34;
  
  this_00 = &this->_var;
  bVar1 = primvar::PrimVar::is_timesamples(this_00);
  if (bVar1) {
    bVar1 = primvar::PrimVar::get_interpolated_value<tinyusdz::value::quatf>
                      (this_00,t,interp,(quatf *)&local_34);
    if (bVar1) {
      __return_storage_ptr__->has_value_ = true;
    }
    else {
      __return_storage_ptr__->has_value_ = false;
      local_34.has_value_ = false;
      local_34._1_3_ = 0;
      local_34.contained.data.__align = (anon_struct_4_0_00000001_for___align)0x0;
      local_34.contained._4_4_ = 0;
      local_34.contained._8_4_ = 0;
    }
    *(undefined4 *)&__return_storage_ptr__->contained = local_34._0_4_;
    *(undefined4 *)((long)&__return_storage_ptr__->contained + 4) = local_34.contained.data.__align;
    *(undefined4 *)((long)&__return_storage_ptr__->contained + 8) = local_34.contained._4_4_;
    *(undefined4 *)((long)&__return_storage_ptr__->contained + 0xc) = local_34.contained._8_4_;
  }
  else {
    primvar::PrimVar::get_value<tinyusdz::value::quatf>(&local_34,this_00);
    __return_storage_ptr__->has_value_ = local_34.has_value_;
    if (local_34.has_value_ == true) {
      *(ulong *)&__return_storage_ptr__->contained =
           CONCAT44(local_34.contained._4_4_,local_34.contained.data.__align);
      *(ulong *)((long)&__return_storage_ptr__->contained + 8) =
           CONCAT44(local_34.contained._12_4_,local_34.contained._8_4_);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_value(double t = value::TimeCode::Default(), 
          value::TimeSampleInterpolationType interp =
               value::TimeSampleInterpolationType::Linear) const {
    if (is_timesamples()) {
      T value;
      if (get_interpolated_value(&value, t, interp)) {
        return value;
      }
      return nonstd::nullopt;
    }

    return _var.get_value<T>();
  }